

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void c4::afree(void *ptr)

{
  code *in_RAX;
  code *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = (code *)detail::s_afree;
  if (detail::s_afree == (undefined *)0x0) {
    afree();
    UNRECOVERED_JUMPTABLE = in_RAX;
  }
  (*UNRECOVERED_JUMPTABLE)(ptr);
  return;
}

Assistant:

void afree(void* ptr)
{
    C4_ASSERT_MSG(c4::get_afree() != nullptr, "did you forget to call set_afree()?");
    auto fn = c4::get_afree();
    fn(ptr);
}